

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phix_manager.c
# Opt level: O0

int write_phix(int coff,opj_codestream_info_t cstr_info,opj_bool EPHused,int j2klen,opj_cio_t *cio)

{
  opj_codestream_info_t cstr_info_00;
  undefined1 auVar1 [60];
  undefined8 uVar2;
  int iVar3;
  opj_cio_t *cio_00;
  opj_cio_t *in_RCX;
  undefined4 in_EDX;
  undefined4 in_ESI;
  undefined4 in_EDI;
  undefined8 uStack0000000000000008;
  opj_cio_t *poStack0000000000000010;
  opj_cio_t *poStack0000000000000018;
  undefined8 uStack0000000000000020;
  undefined8 uStack0000000000000028;
  undefined8 uStack0000000000000030;
  undefined4 uStack0000000000000038;
  undefined1 in_stack_00000000 [60];
  int in_stack_0000003c;
  undefined8 uStack0000000000000040;
  undefined4 uStack0000000000000048;
  undefined4 uStack000000000000004c;
  undefined4 uStack0000000000000050;
  undefined4 uStack0000000000000054;
  undefined8 uStack0000000000000058;
  opj_jp2_box_t *box;
  int i;
  int compno;
  int lenp;
  int len;
  undefined8 in_stack_ffffffffffffff58;
  opj_cio_t *in_stack_ffffffffffffff60;
  opj_cio_t *in_stack_ffffffffffffff68;
  undefined8 in_stack_ffffffffffffff70;
  int j2klen_00;
  int EPHused_00;
  int pos;
  int in_stack_ffffffffffffffe4;
  undefined4 in_stack_fffffffffffffff0;
  
  auVar1 = in_stack_00000000;
  pos = 0;
  cio_00 = (opj_cio_t *)calloc((long)in_stack_0000003c,0xc);
  for (j2klen_00 = 0; j2klen_00 < 2; j2klen_00 = j2klen_00 + 1) {
    if (j2klen_00 != 0) {
      cio_seek(in_RCX,pos);
    }
    pos = cio_tell(in_RCX);
    cio_skip(in_RCX,4);
    cio_write(in_stack_ffffffffffffff68,(unsigned_long_long)in_stack_ffffffffffffff60,
              (int)((ulong)in_stack_ffffffffffffff58 >> 0x20));
    write_manf((int)((ulong)in_stack_ffffffffffffff70 >> 0x20),(int)in_stack_ffffffffffffff70,
               (opj_jp2_box_t *)in_stack_ffffffffffffff68,in_stack_ffffffffffffff60);
    for (EPHused_00 = 0; uVar2 = uStack0000000000000008, EPHused_00 < in_stack_0000003c;
        EPHused_00 = EPHused_00 + 1) {
      cstr_info_00.D_max._4_4_ = in_EDX;
      cstr_info_00.D_max._0_4_ = in_stack_fffffffffffffff0;
      cstr_info_00.packno = in_ESI;
      cstr_info_00.index_write = in_EDI;
      cstr_info_00._76_4_ = in_stack_0000003c;
      cstr_info_00._16_60_ = auVar1;
      cstr_info_00.marker = (opj_marker_info_t *)uStack0000000000000040;
      cstr_info_00.maxmarknum = uStack0000000000000048;
      cstr_info_00.main_head_start = uStack000000000000004c;
      cstr_info_00.main_head_end = uStack0000000000000050;
      cstr_info_00.codestream_size = uStack0000000000000054;
      cstr_info_00.tile = (opj_tile_info_t *)uStack0000000000000058;
      in_stack_ffffffffffffff60 = poStack0000000000000010;
      in_stack_ffffffffffffff68 = poStack0000000000000018;
      in_stack_ffffffffffffff70 = uStack0000000000000020;
      iVar3 = write_phixfaix(in_stack_ffffffffffffffe4,pos,cstr_info_00,EPHused_00,j2klen_00,cio_00)
      ;
      *(int *)((long)&cio_00->cinfo + (long)EPHused_00 * 0xc) = iVar3;
      *(undefined4 *)((long)&cio_00->cinfo + (long)EPHused_00 * 0xc + 4) = 0x66616978;
      in_stack_ffffffffffffff58 = uVar2;
    }
    in_stack_ffffffffffffffe4 = cio_tell(in_RCX);
    in_stack_ffffffffffffffe4 = in_stack_ffffffffffffffe4 - pos;
    cio_seek(in_RCX,pos);
    cio_write(in_stack_ffffffffffffff68,(unsigned_long_long)in_stack_ffffffffffffff60,
              (int)((ulong)in_stack_ffffffffffffff58 >> 0x20));
    cio_seek(in_RCX,pos + in_stack_ffffffffffffffe4);
  }
  free(cio_00);
  return in_stack_ffffffffffffffe4;
}

Assistant:

int write_phix( int coff, opj_codestream_info_t cstr_info, opj_bool EPHused, int j2klen, opj_cio_t *cio)
{
  int len, lenp=0, compno, i;
  opj_jp2_box_t *box;

  box = (opj_jp2_box_t *)opj_calloc( cstr_info.numcomps, sizeof(opj_jp2_box_t));
  
  for( i=0;i<2;i++){
    if (i) cio_seek( cio, lenp);
      
    lenp = cio_tell( cio);
    cio_skip( cio, 4);              /* L [at the end] */
    cio_write( cio, JPIP_PHIX, 4);  /* PHIX           */
      
    write_manf( i, cstr_info.numcomps, box, cio);

    for( compno=0; compno<cstr_info.numcomps; compno++){       
      box[compno].length = write_phixfaix( coff, compno, cstr_info, EPHused, j2klen, cio);
      box[compno].type = JPIP_FAIX;
    }

    len = cio_tell( cio)-lenp;
    cio_seek( cio, lenp);
    cio_write( cio, len, 4);        /* L              */
    cio_seek( cio, lenp+len);
  }

  opj_free(box);

  return len;
}